

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

Quaternion * AML::operator/(Quaternion *lhs,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Quaternion *in_RDI;
  
  dVar1 = (lhs->field_0).data[1];
  dVar2 = (lhs->field_0).data[2];
  dVar3 = (lhs->field_0).data[3];
  (in_RDI->field_0).data[0] = (lhs->field_0).data[0] / s;
  (in_RDI->field_0).data[1] = dVar1 / s;
  (in_RDI->field_0).data[2] = dVar2 / s;
  (in_RDI->field_0).data[3] = dVar3 / s;
  return in_RDI;
}

Assistant:

Quaternion operator/(const Quaternion& lhs, double s) { return (Quaternion(lhs) /= s); }